

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_groups.cc
# Opt level: O0

void anon_unknown.dwarf_e35ba::Json2Type(Value *value,RamListGroupsResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<aliyun::RamListGroupsGroupType> local_39;
  string local_38;
  RamListGroupsResponseType *local_18;
  RamListGroupsResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RamListGroupsResponseType *)value;
  bVar1 = Json::Value::isMember(value,"IsTruncated");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"IsTruncated");
    bVar1 = Json::Value::asBool(pVVar2);
    local_18->is_truncated = bVar1;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Marker");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Marker");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->marker,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Groups");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Groups");
    bVar1 = Json::Value::isMember(pVVar2,"Group");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"Groups");
      pVVar2 = Json::Value::operator[](pVVar2,"Group");
      Json2Array<aliyun::RamListGroupsGroupType>::Json2Array(&local_39,pVVar2,&local_18->groups);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RamListGroupsResponseType* item) {
  if(value.isMember("IsTruncated")) {
    item->is_truncated = value["IsTruncated"].asBool();
  }
  if(value.isMember("Marker")) {
    item->marker = value["Marker"].asString();
  }
  if(value.isMember("Groups") && value["Groups"].isMember("Group")) {
    Json2Array<RamListGroupsGroupType>(value["Groups"]["Group"], &item->groups);
  }
}